

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O3

void * tommy_hashtable_remove_existing(tommy_hashtable *hashtable,tommy_hashtable_node *node)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  tommy_hashtable_node **pptVar4;
  tommy_hashtable_node *ptVar5;
  tommy_node_struct *ptVar6;
  tommy_node_struct *ptVar7;
  tommy_node_struct *ptVar8;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = hashtable->bucket_mask;
  uVar2 = node->key;
  pptVar4 = hashtable->bucket;
  ptVar5 = ((tommy_node_struct *)(pptVar4 + (uVar1 & uVar2)))->next;
  ptVar6 = node->next;
  ptVar7 = node->prev;
  ptVar8 = ptVar6;
  if (ptVar6 == (tommy_node_struct *)0x0) {
    ptVar8 = ptVar5;
  }
  ptVar8->prev = ptVar7;
  if (ptVar5 == node) {
    ptVar7 = (tommy_node_struct *)(pptVar4 + (uVar1 & uVar2));
  }
  ptVar7->next = ptVar6;
  hashtable->count = hashtable->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashtable_remove_existing(tommy_hashtable* hashtable, tommy_hashtable_node* node)
{
	tommy_count_t pos = node->key & hashtable->bucket_mask;

	tommy_list_remove_existing(&hashtable->bucket[pos], node);

	--hashtable->count;

	return node->data;
}